

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          ArrayPtr<const_char> *rest,ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,
          ArrayPtr<const_char> *rest_3,ArrayPtr<const_char> *rest_4,String *rest_5,
          ArrayPtr<const_char> *rest_6,CappedArray<char,_14UL> *rest_7,ArrayPtr<const_char> *rest_8,
          ArrayPtr<const_char> *rest_9,ArrayPtr<const_char> *rest_10,StringTree *rest_11,
          StringTree *rest_12,ArrayPtr<const_char> *rest_13,ArrayPtr<const_char> *rest_14,
          ArrayPtr<const_char> *rest_15,ArrayPtr<const_char> *rest_16,ArrayPtr<const_char> *rest_17,
          String *rest_18,ArrayPtr<const_char> *rest_19,ArrayPtr<const_char> *rest_20,
          ArrayPtr<const_char> *rest_21,String *rest_22,ArrayPtr<const_char> *rest_23,
          CappedArray<char,_14UL> *rest_24,ArrayPtr<const_char> *rest_25,StringTree *rest_26,
          StringTree *rest_27,StringTree *rest_28,StringTree *rest_29,ArrayPtr<const_char> *rest_30,
          ArrayPtr<const_char> *rest_31,ArrayPtr<const_char> *rest_32,ArrayPtr<const_char> *rest_33,
          ArrayPtr<const_char> *rest_34,String *rest_35,ArrayPtr<const_char> *rest_36,
          ArrayPtr<const_char> *rest_37,ArrayPtr<const_char> *rest_38,String *rest_39,
          ArrayPtr<const_char> *rest_40,CappedArray<char,_14UL> *rest_41,
          ArrayPtr<const_char> *rest_42,StringTree *rest_43,StringTree *rest_44,
          ArrayPtr<const_char> *rest_45,String *rest_46,ArrayPtr<const_char> *rest_47,
          ArrayPtr<const_char> *rest_48,ArrayPtr<const_char> *rest_49,ArrayPtr<const_char> *rest_50,
          ArrayPtr<const_char> *rest_51,ArrayPtr<const_char> *rest_52,ArrayPtr<const_char> *rest_53,
          String *rest_54,ArrayPtr<const_char> *rest_55,CappedArray<char,_14UL> *rest_56,
          ArrayPtr<const_char> *rest_57,StringTree *rest_58,StringTree *rest_59,
          ArrayPtr<const_char> *rest_60)

{
  ArrayPtr<const_char> *pAVar1;
  char *pos_00;
  ArrayPtr<const_char> *rest_61;
  ArrayPtr<const_char> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  String *rest_4_00;
  ArrayPtr<const_char> *rest_5_00;
  CappedArray<char,_14UL> *rest_6_00;
  ArrayPtr<const_char> *rest_7_00;
  ArrayPtr<const_char> *rest_8_00;
  ArrayPtr<const_char> *rest_9_00;
  StringTree *rest_10_00;
  StringTree *rest_11_00;
  ArrayPtr<const_char> *rest_12_00;
  ArrayPtr<const_char> *rest_13_00;
  ArrayPtr<const_char> *rest_14_00;
  ArrayPtr<const_char> *rest_15_00;
  ArrayPtr<const_char> *rest_16_00;
  String *rest_17_00;
  ArrayPtr<const_char> *rest_18_00;
  ArrayPtr<const_char> *rest_19_00;
  ArrayPtr<const_char> *rest_20_00;
  String *rest_21_00;
  ArrayPtr<const_char> *rest_22_00;
  CappedArray<char,_14UL> *rest_23_00;
  ArrayPtr<const_char> *rest_24_00;
  StringTree *rest_25_00;
  StringTree *rest_26_00;
  StringTree *rest_27_00;
  StringTree *rest_28_00;
  ArrayPtr<const_char> *rest_29_00;
  ArrayPtr<const_char> *rest_30_00;
  ArrayPtr<const_char> *rest_31_00;
  ArrayPtr<const_char> *rest_32_00;
  ArrayPtr<const_char> *rest_33_00;
  String *rest_34_00;
  ArrayPtr<const_char> *rest_35_00;
  ArrayPtr<const_char> *rest_36_00;
  ArrayPtr<const_char> *rest_37_00;
  String *rest_38_00;
  ArrayPtr<const_char> *rest_39_00;
  CappedArray<char,_14UL> *rest_40_00;
  ArrayPtr<const_char> *rest_41_00;
  StringTree *rest_42_00;
  StringTree *rest_43_00;
  ArrayPtr<const_char> *rest_44_00;
  String *rest_45_00;
  ArrayPtr<const_char> *rest_46_00;
  ArrayPtr<const_char> *rest_47_00;
  ArrayPtr<const_char> *rest_48_00;
  ArrayPtr<const_char> *rest_49_00;
  ArrayPtr<const_char> *rest_50_00;
  ArrayPtr<const_char> *rest_51_00;
  ArrayPtr<const_char> *rest_52_00;
  String *rest_53_00;
  ArrayPtr<const_char> *rest_54_00;
  CappedArray<char,_14UL> *rest_55_00;
  ArrayPtr<const_char> *rest_56_00;
  StringTree *rest_57_00;
  StringTree *rest_58_00;
  ArrayPtr<const_char> *rest_59_00;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  ArrayPtr<const_char> *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(first);
  pos_00 = _::fill<kj::ArrayPtr<char_const>>(pos,pAVar1);
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(rest);
  rest_61 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::String>(rest_5);
  rest_5_00 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  rest_6_00 = fwd<kj::CappedArray<char,14ul>>(rest_7);
  rest_7_00 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  rest_8_00 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  rest_9_00 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  rest_10_00 = fwd<kj::StringTree>(rest_11);
  rest_11_00 = fwd<kj::StringTree>(rest_12);
  rest_12_00 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  rest_13_00 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  rest_14_00 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  rest_15_00 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  rest_16_00 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  rest_17_00 = fwd<kj::String>(rest_18);
  rest_18_00 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  rest_19_00 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  rest_20_00 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  rest_21_00 = fwd<kj::String>(rest_22);
  rest_22_00 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  rest_23_00 = fwd<kj::CappedArray<char,14ul>>(rest_24);
  rest_24_00 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  rest_25_00 = fwd<kj::StringTree>(rest_26);
  rest_26_00 = fwd<kj::StringTree>(rest_27);
  rest_27_00 = fwd<kj::StringTree>(rest_28);
  rest_28_00 = fwd<kj::StringTree>(rest_29);
  rest_29_00 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  rest_30_00 = fwd<kj::ArrayPtr<char_const>>(rest_31);
  rest_31_00 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  rest_32_00 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  rest_33_00 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  rest_34_00 = fwd<kj::String>(rest_35);
  rest_35_00 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  rest_36_00 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  rest_37_00 = fwd<kj::ArrayPtr<char_const>>(rest_38);
  rest_38_00 = fwd<kj::String>(rest_39);
  rest_39_00 = fwd<kj::ArrayPtr<char_const>>(rest_40);
  rest_40_00 = fwd<kj::CappedArray<char,14ul>>(rest_41);
  rest_41_00 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  rest_42_00 = fwd<kj::StringTree>(rest_43);
  rest_43_00 = fwd<kj::StringTree>(rest_44);
  rest_44_00 = fwd<kj::ArrayPtr<char_const>>(rest_45);
  rest_45_00 = fwd<kj::String>(rest_46);
  rest_46_00 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  rest_47_00 = fwd<kj::ArrayPtr<char_const>>(rest_48);
  rest_48_00 = fwd<kj::ArrayPtr<char_const>>(rest_49);
  rest_49_00 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  rest_50_00 = fwd<kj::ArrayPtr<char_const>>(rest_51);
  rest_51_00 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  rest_52_00 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  rest_53_00 = fwd<kj::String>(rest_54);
  rest_54_00 = fwd<kj::ArrayPtr<char_const>>(rest_55);
  rest_55_00 = fwd<kj::CappedArray<char,14ul>>(rest_56);
  rest_56_00 = fwd<kj::ArrayPtr<char_const>>(rest_57);
  rest_57_00 = fwd<kj::StringTree>(rest_58);
  rest_58_00 = fwd<kj::StringTree>(rest_59);
  rest_59_00 = fwd<kj::ArrayPtr<char_const>>(rest_60);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,pos_00,branchIndex,pAVar1,rest_61,rest_1_00,rest_2_00,rest_3_00,rest_4_00,
             rest_5_00,rest_6_00,rest_7_00,rest_8_00,rest_9_00,rest_10_00,rest_11_00,rest_12_00,
             rest_13_00,rest_14_00,rest_15_00,rest_16_00,rest_17_00,rest_18_00,rest_19_00,rest_20_00
             ,rest_21_00,rest_22_00,rest_23_00,rest_24_00,rest_25_00,rest_26_00,rest_27_00,
             rest_28_00,rest_29_00,rest_30_00,rest_31_00,rest_32_00,rest_33_00,rest_34_00,rest_35_00
             ,rest_36_00,rest_37_00,rest_38_00,rest_39_00,rest_40_00,rest_41_00,rest_42_00,
             rest_43_00,rest_44_00,rest_45_00,rest_46_00,rest_47_00,rest_48_00,rest_49_00,rest_50_00
             ,rest_51_00,rest_52_00,rest_53_00,rest_54_00,rest_55_00,rest_56_00,rest_57_00,
             rest_58_00,rest_59_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}